

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O2

string * __thiscall
lest::
to_string<nonstd::sv_lite::basic_string_view<char,std::char_traits<char>>,nonstd::sv_lite::basic_string_view<char,std::char_traits<char>>>
          (string *__return_storage_ptr__,lest *this,
          basic_string_view<char,_std::char_traits<char>_> *lhs,string *op,
          basic_string_view<char,_std::char_traits<char>_> *rhs)

{
  ostream *poVar1;
  basic_string_view<char,_std::char_traits<char>_> *v;
  basic_string_view<char,_std::char_traits<char>_> *v_00;
  ostringstream os;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  pointer local_1b8;
  size_type local_1b0;
  undefined8 local_1a8;
  undefined8 local_1a0;
  ostringstream local_198 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_198);
  local_1a8 = *(undefined8 *)this;
  local_1a0 = *(undefined8 *)(this + 8);
  nonstd::sv_lite::to_string<char,std::char_traits<char>>(&bStack_1f8,(sv_lite *)&local_1a8,v);
  poVar1 = std::operator<<((ostream *)local_198,(string *)&bStack_1f8);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = std::operator<<(poVar1,(string *)lhs);
  poVar1 = std::operator<<(poVar1," ");
  local_1b8 = (op->_M_dataplus)._M_p;
  local_1b0 = op->_M_string_length;
  nonstd::sv_lite::to_string<char,std::char_traits<char>>(&local_1d8,(sv_lite *)&local_1b8,v_00);
  std::operator<<(poVar1,(string *)&local_1d8);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::ostringstream::str();
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&bStack_1f8);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::ostringstream::~ostringstream(local_198);
  return __return_storage_ptr__;
}

Assistant:

std::string to_string( L const & lhs, std::string op, R const & rhs )
{
    std::ostringstream os; os << to_string( lhs ) << " " << op << " " << to_string( rhs ); return os.str();
}